

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall
basist::ktx2_transcoder::transcode_image_level
          (ktx2_transcoder *this,uint32_t level_index,uint32_t layer_index,uint32_t face_index,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,
          transcoder_texture_format fmt,uint32_t decode_flags,
          uint32_t output_row_pitch_in_blocks_or_pixels,uint32_t output_rows_in_pixels,int channel0,
          int channel1,ktx2_transcoder_state *pState)

{
  int iVar1;
  uint32_t alpha_length;
  ktx2_etc1s_image_desc *pkVar2;
  ktx2_level_index *pkVar3;
  bool bVar4;
  uint uVar5;
  uint32_t orig_width;
  uint uVar6;
  ktx2_transcoder_state *pState_00;
  uint32_t alpha_offset;
  uint8_t *puVar7;
  uint compressed_data_length;
  uint32_t orig_height;
  uint num_blocks_y;
  uint uVar8;
  uint32_t in_stack_ffffffffffffff48;
  basisu_transcoder_state *in_stack_ffffffffffffff80;
  
  if (this->m_pData != (uint8_t *)0x0) {
    pState_00 = &this->m_def_transcoder_state;
    if (pState != (ktx2_transcoder_state *)0x0) {
      pState_00 = pState;
    }
    if (level_index < (this->m_levels).m_size) {
      if (*(uint *)(this->m_header).m_face_count.m_bytes < 2) {
        if (face_index != 0) {
          return false;
        }
      }
      else if (5 < face_index) {
        return false;
      }
      iVar1 = *(int *)(this->m_header).m_layer_count.m_bytes;
      if (layer_index < iVar1 + (uint)(iVar1 == 0)) {
        if (*(int *)(this->m_header).m_supercompression_scheme.m_bytes == 2) {
          if (pState_00->m_uncomp_data_level_index != level_index) {
            bVar4 = decompress_level_data(this,level_index,&pState_00->m_level_uncomp_data);
            if (!bVar4) {
              return false;
            }
            pState_00->m_uncomp_data_level_index = level_index;
          }
          puVar7 = (pState_00->m_level_uncomp_data).m_p;
          pkVar3 = (ktx2_level_index *)&pState_00->m_level_uncomp_data;
        }
        else {
          pkVar3 = (this->m_levels).m_p + level_index;
          puVar7 = this->m_pData + *(uint *)(pkVar3->m_byte_offset).m_bytes;
        }
        uVar5 = *(uint *)(this->m_header).m_pixel_width.m_bytes >> ((byte)level_index & 0x1f);
        orig_width = uVar5 + (uVar5 == 0);
        uVar5 = *(uint *)(this->m_header).m_pixel_height.m_bytes >> ((byte)level_index & 0x1f);
        orig_height = uVar5 + (uVar5 == 0);
        uVar5 = orig_width + 3 >> 2;
        num_blocks_y = orig_height + 3 >> 2;
        if (this->m_format == cUASTC4x4) {
          if (level_index < (this->m_levels).m_size) {
            uVar6 = *(uint *)(pkVar3->m_byte_length).m_bytes;
            if (uVar6 != *(uint *)(this->m_levels).m_p[level_index].m_uncompressed_byte_length.
                                  m_bytes) {
              __assert_fail("uncomp_level_data_size == m_levels[level_index].m_uncompressed_byte_length"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x4315,
                            "bool basist::ktx2_transcoder::transcode_image_level(uint32_t, uint32_t, uint32_t, void *, uint32_t, basist::transcoder_texture_format, uint32_t, uint32_t, uint32_t, int, int, ktx2_transcoder_state *)"
                           );
            }
            compressed_data_length = uVar5 * num_blocks_y * 0x10;
            uVar8 = (layer_index * *(int *)(this->m_header).m_face_count.m_bytes + face_index) *
                    compressed_data_length;
            if (uVar6 <= uVar8) {
              return false;
            }
            if ((ulong)uVar6 - (ulong)uVar8 < (ulong)compressed_data_length) {
              return false;
            }
            bVar4 = basisu_lowlevel_uastc_transcoder::transcode_image
                              ((basisu_lowlevel_uastc_transcoder *)(ulong)this->m_has_alpha,fmt,
                               pOutput_blocks,output_blocks_buf_size_in_blocks_or_pixels,
                               puVar7 + uVar8,compressed_data_length,uVar5,num_blocks_y,orig_width,
                               orig_height,in_stack_ffffffffffffff48,0,compressed_data_length,
                               decode_flags,this->m_has_alpha,false,
                               output_row_pitch_in_blocks_or_pixels,in_stack_ffffffffffffff80,
                               output_rows_in_pixels,channel0,channel1);
            if (bVar4) {
              return true;
            }
            return false;
          }
LAB_0015153b:
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                        ,0x178,
                        "T &basisu::vector<basist::ktx2_level_index>::operator[](size_t) [T = basist::ktx2_level_index]"
                       );
        }
        if (this->m_format != cETC1S) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x4335,
                        "bool basist::ktx2_transcoder::transcode_image_level(uint32_t, uint32_t, uint32_t, void *, uint32_t, basist::transcoder_texture_format, uint32_t, uint32_t, uint32_t, int, int, ktx2_transcoder_state *)"
                       );
        }
        if ((this->m_etc1s_transcoder).m_local_endpoints.m_size != 0) {
          iVar1 = *(int *)(this->m_header).m_layer_count.m_bytes;
          uVar6 = ((iVar1 + (uint)(iVar1 == 0)) * level_index + layer_index) *
                  *(int *)(this->m_header).m_face_count.m_bytes + face_index;
          if ((this->m_etc1s_image_descs).m_size <= uVar6) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x42f9,
                          "bool basist::ktx2_transcoder::transcode_image_level(uint32_t, uint32_t, uint32_t, void *, uint32_t, basist::transcoder_texture_format, uint32_t, uint32_t, uint32_t, int, int, ktx2_transcoder_state *)"
                         );
          }
          if ((this->m_levels).m_size <= level_index) goto LAB_0015153b;
          pkVar2 = (this->m_etc1s_image_descs).m_p;
          iVar1 = *(int *)(this->m_levels).m_p[level_index].m_byte_offset.m_bytes;
          alpha_length = *(uint32_t *)pkVar2[uVar6].m_alpha_slice_byte_length.m_bytes;
          if (alpha_length == 0) {
            alpha_offset = 0;
          }
          else {
            alpha_offset = iVar1 + *(int *)pkVar2[uVar6].m_alpha_slice_byte_offset.m_bytes;
          }
          bVar4 = basisu_lowlevel_etc1s_transcoder::transcode_image
                            (&this->m_etc1s_transcoder,fmt,pOutput_blocks,
                             output_blocks_buf_size_in_blocks_or_pixels,this->m_pData,
                             this->m_data_size,uVar5,num_blocks_y,orig_width,orig_height,level_index
                             ,*(int *)pkVar2[uVar6].m_rgb_slice_byte_offset.m_bytes + iVar1,
                             *(uint32_t *)pkVar2[uVar6].m_rgb_slice_byte_length.m_bytes,alpha_offset
                             ,alpha_length,decode_flags,this->m_has_alpha,this->m_is_video,
                             output_row_pitch_in_blocks_or_pixels,&pState_00->m_transcoder_state,
                             output_rows_in_pixels);
          if (bVar4) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ktx2_transcoder::transcode_image_level(
		uint32_t level_index, uint32_t layer_index, uint32_t face_index, 
		void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		basist::transcoder_texture_format fmt,
		uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, uint32_t output_rows_in_pixels, int channel0, int channel1,
		ktx2_transcoder_state* pState)
	{
		if (!m_pData)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: Must call init() first\n");
			return false;
		}

		if (!pState)
			pState = &m_def_transcoder_state;
										
		if (level_index >= m_levels.size())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: level_index >= m_levels.size()\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			if (face_index >= 6)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: face_index >= 6\n");
				return false;
			}
		}
		else if (face_index != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: face_index != 0\n");
			return false;
		}

		if (layer_index >= basisu::maximum<uint32_t>(m_header.m_layer_count, 1))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: layer_index >= maximum<uint32_t>(m_header.m_layer_count, 1)\n");
			return false;
		}

		const uint8_t* pComp_level_data = m_pData + m_levels[level_index].m_byte_offset;
		uint64_t comp_level_data_size = m_levels[level_index].m_byte_length;
		
		const uint8_t* pUncomp_level_data = pComp_level_data;
		uint64_t uncomp_level_data_size = comp_level_data_size;

		if (uncomp_level_data_size > UINT32_MAX)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: uncomp_level_data_size > UINT32_MAX\n");
			return false;
		}
				
		if (m_header.m_supercompression_scheme == KTX2_SS_ZSTANDARD)
		{
			// Check if we've already decompressed this level's supercompressed data.
			if ((int)level_index != pState->m_uncomp_data_level_index)
			{
				// Uncompress the entire level's supercompressed data.
				if (!decompress_level_data(level_index, pState->m_level_uncomp_data))
				{
					BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: decompress_level_data() failed\n");
					return false;
				}
				pState->m_uncomp_data_level_index = level_index;
			}

			pUncomp_level_data = pState->m_level_uncomp_data.data();
			uncomp_level_data_size = pState->m_level_uncomp_data.size();
		}
				
		const uint32_t level_width = basisu::maximum<uint32_t>(m_header.m_pixel_width >> level_index, 1);
		const uint32_t level_height = basisu::maximum<uint32_t>(m_header.m_pixel_height >> level_index, 1);
		const uint32_t num_blocks_x = (level_width + 3) >> 2;
		const uint32_t num_blocks_y = (level_height + 3) >> 2;
		
		if (m_format == basist::basis_tex_format::cETC1S)
		{
			// Ensure start_transcoding() was called.
			if (m_etc1s_transcoder.get_endpoints().empty())
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: must call start_transcoding() first\n");
				return false;
			}

			const uint32_t etc1s_image_index =
				(level_index * basisu::maximum<uint32_t>(m_header.m_layer_count, 1) * m_header.m_face_count) +
				layer_index * m_header.m_face_count +
				face_index;
		
			// Sanity check
			if (etc1s_image_index >= m_etc1s_image_descs.size())
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: etc1s_image_index >= m_etc1s_image_descs.size()\n");
				assert(0);
				return false;
			}

			if (static_cast<uint32_t>(m_data_size) != m_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: File is too large\n");
				return false;
			}

			const ktx2_etc1s_image_desc& image_desc = m_etc1s_image_descs[etc1s_image_index];

			if (!m_etc1s_transcoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, m_pData, static_cast<uint32_t>(m_data_size),
				num_blocks_x, num_blocks_y, level_width, level_height,
				level_index,
				m_levels[level_index].m_byte_offset + image_desc.m_rgb_slice_byte_offset, image_desc.m_rgb_slice_byte_length,
				image_desc.m_alpha_slice_byte_length ? (m_levels[level_index].m_byte_offset + image_desc.m_alpha_slice_byte_offset) : 0, image_desc.m_alpha_slice_byte_length,
				decode_flags, m_has_alpha,
				m_is_video, output_row_pitch_in_blocks_or_pixels, &pState->m_transcoder_state, output_rows_in_pixels))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: ETC1S transcode_image() failed, this is either a bug or the file is corrupted/invalid\n");
				return false;
			}
		}
		else if (m_format == basist::basis_tex_format::cUASTC4x4)
		{
			// Compute length and offset to uncompressed 2D UASTC texture data, given the face/layer indices.
			assert(uncomp_level_data_size == m_levels[level_index].m_uncompressed_byte_length);
			const uint32_t total_2D_image_size = num_blocks_x * num_blocks_y * KTX2_UASTC_BLOCK_SIZE;
						
			const uint32_t uncomp_ofs = (layer_index * m_header.m_face_count + face_index) * total_2D_image_size;

			// Sanity checks
			if (uncomp_ofs >= uncomp_level_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: uncomp_ofs >= total_2D_image_size\n");
				return false;
			}

			if ((uncomp_level_data_size - uncomp_ofs) < total_2D_image_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: (uncomp_level_data_size - uncomp_ofs) < total_2D_image_size\n");
				return false;
			}

			if (!m_uastc_transcoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t*)pUncomp_level_data + uncomp_ofs, (uint32_t)total_2D_image_size, num_blocks_x, num_blocks_y, level_width, level_height, level_index,
				0, (uint32_t)total_2D_image_size,
				decode_flags, m_has_alpha, m_is_video, output_row_pitch_in_blocks_or_pixels, nullptr, output_rows_in_pixels, channel0, channel1))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: UASTC transcode_image() failed, this is either a bug or the file is corrupted/invalid\n");
				return false;
			}
		}
		else
		{
			// Shouldn't get here.
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: Internal error\n");
			assert(0);
			return false;
		}

		return true;
	}